

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

void __thiscall
QXmlStreamReader::addExtraNamespaceDeclaration
          (QXmlStreamReader *this,QXmlStreamNamespaceDeclaration *extraNamespaceDeclaration)

{
  long lVar1;
  QStringView v;
  QAnyStringView s;
  QAnyStringView s_00;
  QXmlStreamReaderPrivate *this_00;
  NamespaceDeclaration *pNVar2;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_RDI;
  long in_FS_OFFSET;
  QStringView QVar3;
  NamespaceDeclaration *namespaceDeclaration;
  QXmlStreamReaderPrivate *d;
  QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration> *in_stack_ffffffffffffff60;
  QAnyStringView *in_stack_ffffffffffffff68;
  qsizetype in_stack_ffffffffffffff70;
  storage_type_conflict *psVar4;
  size_t in_stack_ffffffffffffffa8;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  qsizetype local_38;
  QString *local_20;
  qsizetype qStack_18;
  qsizetype local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QXmlStreamReader *)0x64a2b0);
  pNVar2 = QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration>::push
                     (in_stack_ffffffffffffff60);
  QVar3 = QXmlStreamNamespaceDeclaration::prefix((QXmlStreamNamespaceDeclaration *)0x64a2e6);
  psVar4 = (storage_type_conflict *)QVar3.m_size;
  QVar3.m_data = psVar4;
  QVar3.m_size = in_stack_ffffffffffffff70;
  QAnyStringView::QAnyStringView(in_stack_ffffffffffffff68,QVar3);
  s.m_size = in_stack_ffffffffffffffa8;
  s.field_0.m_data = in_RDI.m_data;
  QXmlStreamPrivateTagStack::addToStringStorage(&this_00->super_QXmlStreamPrivateTagStack,s);
  (pNVar2->prefix).m_size = local_10;
  (pNVar2->prefix).m_string = local_20;
  (pNVar2->prefix).m_pos = qStack_18;
  QVar3 = QXmlStreamNamespaceDeclaration::namespaceUri((QXmlStreamNamespaceDeclaration *)0x64a352);
  v.m_data = psVar4;
  v.m_size = (qsizetype)QVar3.m_data;
  QAnyStringView::QAnyStringView((QAnyStringView *)QVar3.m_size,v);
  s_00.m_size = in_stack_ffffffffffffffa8;
  s_00.field_0.m_data = in_RDI.m_data;
  QXmlStreamPrivateTagStack::addToStringStorage(&this_00->super_QXmlStreamPrivateTagStack,s_00);
  (pNVar2->namespaceUri).m_size = local_38;
  *(undefined4 *)&(pNVar2->namespaceUri).m_string = local_48;
  *(undefined4 *)((long)&(pNVar2->namespaceUri).m_string + 4) = uStack_44;
  *(undefined4 *)&(pNVar2->namespaceUri).m_pos = uStack_40;
  *(undefined4 *)((long)&(pNVar2->namespaceUri).m_pos + 4) = uStack_3c;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamReader::addExtraNamespaceDeclaration(const QXmlStreamNamespaceDeclaration &extraNamespaceDeclaration)
{
    Q_D(QXmlStreamReader);
    QXmlStreamReaderPrivate::NamespaceDeclaration &namespaceDeclaration = d->namespaceDeclarations.push();
    namespaceDeclaration.prefix = d->addToStringStorage(extraNamespaceDeclaration.prefix());
    namespaceDeclaration.namespaceUri = d->addToStringStorage(extraNamespaceDeclaration.namespaceUri());
}